

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O1

void __thiscall stringToUnits_complex_Test::TestBody(stringToUnits_complex_Test *this)

{
  unit_data uVar1;
  uint64_t uVar2;
  ulong uVar3;
  pointer *__ptr;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr_6;
  precise_unit pVar5;
  precise_unit pVar6;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  undefined1 local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  precise_unit local_188;
  undefined1 local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  precise_unit local_158;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  precise_unit local_28;
  
  local_188 = units::precise_unit::operator/
                        ((precise_unit *)units::precise::m,(precise_unit *)units::precise::s);
  _local_198 = units::precise_unit::operator/(&local_188,(precise_unit *)units::precise::s);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"meters per second per second","");
  uVar2 = units::getDefaultFlags();
  local_158 = units::unit_from_string(&local_48,uVar2);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_178,"precise::m / precise::s / precise::s",
             "unit_from_string(\"meters per second per second\")",(precise_unit *)local_198,
             &local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_198);
    if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_170->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x330,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_198 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_198 + 8))();
    }
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  local_188 = units::precise_unit::operator/
                        ((precise_unit *)units::precise::mile,(precise_unit *)units::precise::hr);
  _local_198 = units::precise_unit::operator/(&local_188,(precise_unit *)units::precise::s);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"miles per hour per second","");
  uVar2 = units::getDefaultFlags();
  local_158 = units::unit_from_string(&local_68,uVar2);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_178,"precise::mile / precise::hr / precise::s",
             "unit_from_string(\"miles per hour per second\")",(precise_unit *)local_198,&local_158)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_198);
    if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_170->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x333,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_198 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_198 + 8))();
    }
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  local_188.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)(units::precise::micro + 8),(unit_data *)(units::precise::mol + 8));
  local_188.multiplier_ = (double)&DAT_3eb0c6f7a0b5ed8d;
  local_188.commodity_ = 0;
  local_158.base_units_ = (unit_data)0x3;
  local_158.commodity_ = 0;
  local_158.multiplier_ = 0.0001;
  _local_198 = units::precise_unit::operator/(&local_188,&local_158);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"micromole per deciliter","");
  uVar2 = units::getDefaultFlags();
  local_28 = units::unit_from_string(&local_88,uVar2);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_178,"precise::micro * precise::mol / (precise_unit(0.1, precise::L))"
             ,"unit_from_string(\"micromole per deciliter\")",(precise_unit *)local_198,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_198);
    if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_170->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x336,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_198 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_198 + 8))();
    }
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"$ per 24 hrs","");
  uVar2 = units::getDefaultFlags();
  _local_198 = units::unit_from_string(&local_a8,uVar2);
  local_158.base_units_ = (unit_data)0x10;
  local_158.commodity_ = 0;
  local_158.multiplier_ = 86400.0;
  local_188 = units::precise_unit::operator/((precise_unit *)units::precise::currency,&local_158);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_178,"unit_from_string(\"$ per 24 hrs\")",
             "precise::currency / precise_unit(24.0, precise::hr)",(precise_unit *)local_198,
             &local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_198);
    if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_170->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x339,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_198 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_198 + 8))();
    }
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"kilogram / minute(Gasoline at 15.5 C)","");
  uVar2 = units::getDefaultFlags();
  _local_198 = units::unit_from_string(&local_c8,uVar2);
  testing::internal::CmpHelperNE<units::precise_unit,units::precise_unit>
            ((internal *)local_178,"unit_from_string(\"kilogram / minute(Gasoline at 15.5 C)\")",
             "precise::error",(precise_unit *)local_198,(precise_unit *)units::precise::error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_198);
    if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_170->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x33d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_198 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_198 + 8))();
    }
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"g/(8.h){shift}","");
  uVar2 = units::getDefaultFlags();
  _local_198 = units::unit_from_string(&local_e8,uVar2);
  testing::internal::CmpHelperNE<units::precise_unit,units::precise_unit>
            ((internal *)local_178,"unit_from_string(\"g/(8.h){shift}\")","precise::error",
             (precise_unit *)local_198,(precise_unit *)units::precise::error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_198);
    if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_170->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x33e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_198 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_198 + 8))();
    }
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  uVar1 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::ohm + 8),(unit_data *)(units::precise::meter + 8)
                    );
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"statohm micrometer","");
  uVar2 = units::getDefaultFlags();
  pVar5 = units::unit_from_string(&local_108,uVar2);
  local_198[0] = (internal)
                 (pVar5._8_8_ >> 0x20 == 0 &&
                 (((uint)uVar1 ^ (uint)pVar5.base_units_) & 0x307ffff) == 0);
  local_190._0_4_ = (unit_data)0x0;
  local_190._4_4_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (local_198[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_178,(internal *)local_198,
               (AssertionResult *)
               "(precise::ohm * precise::meter) .is_convertible(unit_from_string(\"statohm micrometer\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x341,(char *)CONCAT71(local_178._1_7_,local_178[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_178._1_7_,local_178[0]) != &local_168) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_178._1_7_,local_178[0]),local_168._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_188.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_188.multiplier_ + 8))();
    }
  }
  if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_198 + 8),local_190);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"coulomb/square meter","");
  uVar2 = units::getDefaultFlags();
  pVar5 = units::unit_from_string(&local_128,uVar2);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)pVar5.multiplier_,&local_148,"ampere hour/square meter","");
  uVar2 = units::getDefaultFlags();
  pVar6 = units::unit_from_string(&local_148,uVar2);
  uVar3 = pVar6._8_8_ ^ pVar5._8_8_;
  local_198[0] = (internal)((uVar3 & 0x307ffff) == 0 && uVar3 >> 0x20 == 0);
  local_190._0_4_ = (unit_data)0x0;
  local_190._4_4_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_198[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_178,(internal *)local_198,
               (AssertionResult *)
               "unit_from_string(\"coulomb/square meter\") .is_convertible(unit_from_string(\"ampere hour/square meter\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x344,(char *)CONCAT71(local_178._1_7_,local_178[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_178._1_7_,local_178[0]) != &local_168) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_178._1_7_,local_178[0]),local_168._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_188.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_188.multiplier_ + 8))();
    }
  }
  if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_198 + 8),local_190);
  }
  return;
}

Assistant:

TEST(stringToUnits, complex)
{
    EXPECT_EQ(
        precise::m / precise::s / precise::s,
        unit_from_string("meters per second per second"));
    EXPECT_EQ(
        precise::mile / precise::hr / precise::s,
        unit_from_string("miles per hour per second"));
    EXPECT_EQ(
        precise::micro * precise::mol / (precise_unit(0.1, precise::L)),
        unit_from_string("micromole per deciliter"));
    EXPECT_EQ(
        unit_from_string("$ per 24 hrs"),
        precise::currency / precise_unit(24.0, precise::hr));

    EXPECT_NE(
        unit_from_string("kilogram / minute(Gasoline at 15.5 C)"),
        precise::error);
    EXPECT_NE(unit_from_string("g/(8.h){shift}"), precise::error);

    EXPECT_TRUE((precise::ohm * precise::meter)
                    .is_convertible(unit_from_string("statohm micrometer")));
    EXPECT_TRUE(
        unit_from_string("coulomb/square meter")
            .is_convertible(unit_from_string("ampere hour/square meter")));
}